

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSaveFileLineEdit.cpp
# Opt level: O0

void __thiscall QSaveFileLineEditPrivate::~QSaveFileLineEditPrivate(QSaveFileLineEditPrivate *this)

{
  void *in_RDI;
  
  ~QSaveFileLineEditPrivate((QSaveFileLineEditPrivate *)0x220728);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

class QSaveFileLineEditPrivate : public QObject {
    Q_OBJECT

public:
    explicit QSaveFileLineEditPrivate(QSaveFileLineEdit *widgetP)
        : QObject(widgetP)
        , widget(widgetP)
        , action(new QFileAction(this)) {
        Q_ASSERT(widget);

        action->setType(QFileAction::Type::SaveFile);
        widget->addAction(action, position);

        connect(widget, &QLineEdit::textChanged, this, &QSaveFileLineEditPrivate::textChanged);
        connect(action, &QFileAction::filePathChanged, this, &QSaveFileLineEditPrivate::filePathChanged);
        connect(action, &QFileAction::filePathChanged, widget, &QSaveFileLineEdit::filePathChanged);
    }

    void textChanged(const QString &text) {
        action->setFilePath(text);
    }